

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O2

string * __thiscall
flatbuffers::ts::TsGenerator::GenType_abi_cxx11_
          (string *__return_storage_ptr__,TsGenerator *this,Type *type)

{
  Type *extraout_RDX;
  Type *type_00;
  char *__s;
  undefined4 local_30;
  undefined4 local_2c;
  Parser *local_28;
  string *psStack_20;
  ushort local_18;
  
  switch(*(undefined4 *)&(this->super_BaseGenerator)._vptr_BaseGenerator) {
  case 1:
    GetUnionUnderlyingType((Type *)this);
    type_00 = extraout_RDX;
    goto LAB_001d1d1d;
  case 2:
  case 3:
    __s = "Int8";
    break;
  case 4:
    __s = "Uint8";
    break;
  case 5:
    __s = "Int16";
    break;
  case 6:
    __s = "Uint16";
    break;
  case 7:
    __s = "Int32";
    break;
  case 8:
    __s = "Uint32";
    break;
  case 9:
    __s = "Int64";
    break;
  case 10:
    __s = "Uint64";
    break;
  case 0xb:
    __s = "Float32";
    break;
  case 0xc:
    __s = "Float64";
    break;
  case 0xd:
    __s = "String";
    break;
  case 0xe:
    local_30 = *(undefined4 *)((long)&(this->super_BaseGenerator)._vptr_BaseGenerator + 4);
    local_18 = *(ushort *)&(this->super_BaseGenerator).file_name_;
    type_00 = (Type *)(ulong)local_18;
    local_2c = 0;
    local_28 = (this->super_BaseGenerator).parser_;
    psStack_20 = (this->super_BaseGenerator).path_;
LAB_001d1d1d:
    GenType_abi_cxx11_(__return_storage_ptr__,(TsGenerator *)&stack0xffffffffffffffd0,type_00);
    return __return_storage_ptr__;
  case 0xf:
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)(this->super_BaseGenerator).parser_);
    return __return_storage_ptr__;
  default:
    __s = "flatbuffers.Table";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)&stack0xffffffffffffffd0);
  return __return_storage_ptr__;
}

Assistant:

static std::string GenType(const Type &type) {
    switch (type.base_type) {
      case BASE_TYPE_BOOL:
      case BASE_TYPE_CHAR: return "Int8";
      case BASE_TYPE_UTYPE: return GenType(GetUnionUnderlyingType(type));
      case BASE_TYPE_UCHAR: return "Uint8";
      case BASE_TYPE_SHORT: return "Int16";
      case BASE_TYPE_USHORT: return "Uint16";
      case BASE_TYPE_INT: return "Int32";
      case BASE_TYPE_UINT: return "Uint32";
      case BASE_TYPE_LONG: return "Int64";
      case BASE_TYPE_ULONG: return "Uint64";
      case BASE_TYPE_FLOAT: return "Float32";
      case BASE_TYPE_DOUBLE: return "Float64";
      case BASE_TYPE_STRING: return "String";
      case BASE_TYPE_VECTOR: return GenType(type.VectorType());
      case BASE_TYPE_STRUCT: return type.struct_def->name;
      default: return "flatbuffers.Table";
    }
  }